

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall Raytracer::Image::Image(Image *this,int _width,int _height)

{
  undefined1 auVar1 [16];
  RGB **ppRVar2;
  RGB *pRVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->width = _width;
  this->height = _height;
  uVar6 = (ulong)(uint)_height * 8;
  if (_height < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppRVar2 = (RGB **)operator_new__(uVar6);
  this->datas = ppRVar2;
  if (0 < _height) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)_width;
    uVar6 = SUB168(auVar1 * ZEXT816(0xc),0);
    if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    uVar5 = 0;
    do {
      pRVar3 = (RGB *)operator_new__(uVar6);
      this->datas[uVar5] = pRVar3;
      if (0 < _width) {
        pRVar3 = this->datas[uVar5];
        lVar4 = 0;
        do {
          *(undefined8 *)((long)&pRVar3->r + lVar4) = 0x437f0000;
          *(undefined4 *)((long)&pRVar3->b + lVar4) = 0;
          lVar4 = lVar4 + 0xc;
        } while ((ulong)(uint)_width * 0xc != lVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)_height);
  }
  return;
}

Assistant:

Raytracer::Image::Image( int _width, int _height) {
    this->width = _width;
    this->height = _height;
    this->datas = new Raytracer::RGB * [_height];
    for(int y = 0;y<height;y++){
        datas[y] = new Raytracer::RGB[width];
        for(int x = 0;x<width;x++) {
            datas[y][x].r = 255.f;
            datas[y][x].g = 0.f;
            datas[y][x].b = 0.f;
        }
    }
}